

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceAccessChain
          (ScalarReplacementPass *this,Instruction *chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  Op op;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  IRContext *pIVar5;
  ConstantManager *this_00;
  Constant *this_01;
  size_type __n;
  size_type sVar6;
  const_reference ppIVar7;
  Operand *pOVar8;
  pointer pIVar9;
  IRContext *this_02;
  BasicBlock *block;
  Operand *local_150;
  iterator_template<spvtools::opt::Instruction> local_138;
  iterator iter;
  Operand copy;
  allocator<spvtools::opt::Operand> local_f5;
  uint32_t i;
  iterator local_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  iterator local_88;
  _func_int **local_80;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_60;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  replacementChain;
  uint32_t replacementId;
  iterator chainIter;
  Instruction *var;
  int64_t indexValue;
  Instruction *index;
  uint32_t indexId;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *chain_local;
  ScalarReplacementPass *this_local;
  
  uVar1 = opt::Instruction::GetSingleWordInOperand(chain,1);
  pDVar3 = Pass::get_def_use_mgr((Pass *)this);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
  pIVar5 = Pass::context((Pass *)this);
  this_00 = IRContext::get_constant_mgr(pIVar5);
  this_01 = analysis::ConstantManager::GetConstantFromInst(this_00,pIVar4);
  __n = analysis::Constant::GetSignExtendedValue(this_01);
  if ((-1 < (long)__n) &&
     (sVar6 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              size(replacements), (long)__n < (long)sVar6)) {
    ppIVar7 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[](replacements,__n);
    chainIter.super_iterator.node_ = (iterator)*ppIVar7;
    uVar1 = opt::Instruction::NumInOperands(chain);
    if (uVar1 < 3) {
      pIVar5 = Pass::context((Pass *)this);
      uVar1 = opt::Instruction::result_id(chain);
      uVar2 = opt::Instruction::result_id((Instruction *)chainIter.super_iterator.node_);
      IRContext::ReplaceAllUsesWith(pIVar5,uVar1,uVar2);
    }
    else {
      InstructionList::iterator::iterator((iterator *)&stack0xffffffffffffffb0,chain);
      replacementChain._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
           Pass::TakeNextId((Pass *)this);
      if (replacementChain._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
        return false;
      }
      pIVar4 = (Instruction *)::operator_new(0x70);
      pIVar5 = Pass::context((Pass *)this);
      op = opt::Instruction::opcode(chain);
      uVar2 = opt::Instruction::type_id(chain);
      uVar1 = replacementChain._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      i = opt::Instruction::result_id((Instruction *)chainIter.super_iterator.node_);
      local_f0 = &i;
      local_e8 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_f0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
      Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
      local_88 = &local_b8;
      local_80 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_f5);
      __l._M_len = (size_type)local_80;
      __l._M_array = local_88;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_78,__l,&local_f5);
      opt::Instruction::Instruction(pIVar4,pIVar5,op,uVar2,uVar1,&local_78);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_60,pIVar4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_78);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_f5);
      local_150 = (Operand *)&local_88;
      do {
        local_150 = local_150 + -1;
        Operand::~Operand(local_150);
      } while (local_150 != &local_b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
      for (copy.words.large_data_._M_t.
           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl._4_4_ = 2; uVar1 = opt::Instruction::NumInOperands(chain),
          copy.words.large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl._4_4_ < uVar1;
          copy.words.large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl._4_4_ =
               copy.words.large_data_._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl._4_4_ + 1) {
        pOVar8 = opt::Instruction::GetInOperand
                           (chain,copy.words.large_data_._M_t.
                                  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                  ._M_head_impl._4_4_);
        Operand::Operand((Operand *)&iter,pOVar8);
        pIVar9 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(&local_60);
        opt::Instruction::AddOperand(pIVar9,(Operand *)&iter);
        Operand::~Operand((Operand *)&iter);
      }
      pIVar9 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_60);
      opt::Instruction::UpdateDebugInfoFrom(pIVar9,chain);
      InstructionList::iterator::InsertBefore
                ((iterator *)&local_138,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&stack0xffffffffffffffb0);
      pDVar3 = Pass::get_def_use_mgr((Pass *)this);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&local_138);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar3,pIVar4);
      pIVar5 = Pass::context((Pass *)this);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&local_138);
      this_02 = Pass::context((Pass *)this);
      block = IRContext::get_instr_block(this_02,chain);
      IRContext::set_instr_block(pIVar5,pIVar4,block);
      pIVar5 = Pass::context((Pass *)this);
      uVar1 = opt::Instruction::result_id(chain);
      IRContext::ReplaceAllUsesWith
                (pIVar5,uVar1,
                 replacementChain._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_60);
    }
    return true;
  }
  return false;
}

Assistant:

bool ScalarReplacementPass::ReplaceAccessChain(
    Instruction* chain, const std::vector<Instruction*>& replacements) {
  // Replaces the access chain with either another access chain (with one fewer
  // indexes) or a direct use of the replacement variable.
  uint32_t indexId = chain->GetSingleWordInOperand(1u);
  const Instruction* index = get_def_use_mgr()->GetDef(indexId);
  int64_t indexValue = context()
                           ->get_constant_mgr()
                           ->GetConstantFromInst(index)
                           ->GetSignExtendedValue();
  if (indexValue < 0 ||
      indexValue >= static_cast<int64_t>(replacements.size())) {
    // Out of bounds access, this is illegal IR.  Notice that OpAccessChain
    // indexing is 0-based, so we should also reject index == size-of-array.
    return false;
  } else {
    const Instruction* var = replacements[static_cast<size_t>(indexValue)];
    if (chain->NumInOperands() > 2) {
      // Replace input access chain with another access chain.
      BasicBlock::iterator chainIter(chain);
      uint32_t replacementId = TakeNextId();
      if (replacementId == 0) {
        return false;
      }
      std::unique_ptr<Instruction> replacementChain(new Instruction(
          context(), chain->opcode(), chain->type_id(), replacementId,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
      // Add the remaining indexes.
      for (uint32_t i = 2; i < chain->NumInOperands(); ++i) {
        Operand copy(chain->GetInOperand(i));
        replacementChain->AddOperand(std::move(copy));
      }
      replacementChain->UpdateDebugInfoFrom(chain);
      auto iter = chainIter.InsertBefore(std::move(replacementChain));
      get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
      context()->set_instr_block(&*iter, context()->get_instr_block(chain));
      context()->ReplaceAllUsesWith(chain->result_id(), replacementId);
    } else {
      // Replace with a use of the variable.
      context()->ReplaceAllUsesWith(chain->result_id(), var->result_id());
    }
  }

  return true;
}